

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O2

void __thiscall OpenMD::BondOrderParameter::process(BondOrderParameter *this)

{
  SelectionEvaluator *this_00;
  char cVar1;
  uint uVar2;
  SimInfo *info;
  pointer pdVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  pointer pcVar7;
  StuntDouble *pSVar8;
  mapped_type *pmVar9;
  Molecule *pMVar10;
  mapped_type *pmVar11;
  uint *puVar12;
  mapped_type *pmVar13;
  pointer ppAVar14;
  int iVar15;
  int mmm_1;
  int iVar16;
  key_type kVar17;
  int mmm;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  Atom *this_01;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  double extraout_XMM0_Qa;
  key_type extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  key_type extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  pointer pOVar28;
  undefined8 uVar30;
  undefined1 auVar29 [16];
  uint local_1568;
  int local_155c;
  SelectionSet local_1558;
  BondOrderParameter *local_1540;
  double local_1538;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1530;
  double local_1528;
  undefined8 uStack_1520;
  ulong local_1518;
  SelectionManager *local_1510;
  key_type local_1508;
  key_type local_1500;
  int local_14f8;
  int local_14f4;
  int local_14f0;
  int i;
  double local_14e8;
  double dStack_14e0;
  StuntDouble *local_14d0;
  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_14c8;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_14c0;
  pair<int,_int> lm;
  MoleculeIterator mi;
  Vector<double,_3U> local_1498;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W;
  vector<double,_std::allocator<double>_> Q2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w;
  vector<double,_std::allocator<double>_> q2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> W_hat;
  vector<double,_std::allocator<double>_> Q;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> w_hat;
  vector<double,_std::allocator<double>_> q_l;
  Vector3d vec;
  SphericalHarmonic sphericalHarmonic;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_1348;
  _Vector_base<double,_std::allocator<double>_> local_1330;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  QBar;
  map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  q;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_12b8;
  _Vector_base<double,_std::allocator<double>_> local_12a0;
  DumpReader reader;
  
  mi._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&vec.super_Vector<double,_3U>);
  q._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &q._M_t._M_impl.super__Rb_tree_header._M_header;
  q._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  q._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  q._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  q_l.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  q_l.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  q_l.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  w_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  w_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  w_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QBar._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &QBar._M_t._M_impl.super__Rb_tree_header._M_header;
  QBar._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  QBar._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  QBar._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Q.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Q.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Q.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  W_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  W_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  W_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QBar._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       QBar._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  q._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       q._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SphericalHarmonic::SphericalHarmonic(&sphericalHarmonic);
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&reader,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_14f4 = DumpReader::getNFrames(&reader);
  this->frameCounter_ = 0;
  std::vector<double,_std::allocator<double>_>::resize(&q_l,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&q2,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&w,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&w_hat,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&Q2,0xd);
  std::vector<double,_std::allocator<double>_>::resize(&Q,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&W,0xd);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(&W_hat,0xd);
  this_00 = &this->evaluator_;
  local_1510 = &this->seleMan_;
  local_14c0 = &this->m2Max;
  local_1530 = &this->m2Min;
  local_14c8 = &this->w3j;
  local_1518 = 0;
  iVar15 = 0;
  local_1540 = this;
  while (iVar15 < local_14f4) {
    local_14f8 = iVar15;
    DumpReader::readFrame(&reader,iVar15);
    this->frameCounter_ = this->frameCounter_ + 1;
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1558,this_00);
      SelectionManager::setSelectionSet(local_1510,&local_1558);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1558.bitsets_);
    }
    pSVar8 = SelectionManager::beginSelected(local_1510,&i);
    while (pSVar8 != (StuntDouble *)0x0) {
      local_14f0 = pSVar8->globalIndex_;
      iVar15 = 1;
      local_14d0 = pSVar8;
      for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
        uVar21 = -(int)uVar20;
        iVar16 = iVar15;
        while( true ) {
          bVar23 = iVar16 == 0;
          iVar16 = iVar16 + -1;
          if (bVar23) break;
          local_1558.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((ulong)uVar21 << 0x20 | uVar20);
          pmVar9 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](&q,(key_type *)&local_1558);
          *(undefined8 *)pmVar9->_M_value = 0;
          *(undefined8 *)(pmVar9->_M_value + 8) = 0;
          uVar21 = uVar21 + 1;
        }
        iVar15 = iVar15 + 2;
      }
      pMVar10 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&mi);
      local_155c = 0;
      pSVar8 = local_14d0;
      while (pMVar10 != (Molecule *)0x0) {
        ppAVar14 = (pMVar10->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppAVar14 !=
            (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_0012bde3;
        this_01 = (Atom *)0x0;
        while( true ) {
          if (this_01 == (Atom *)0x0) break;
          if ((this_01->super_StuntDouble).globalIndex_ != local_14f0) {
            StuntDouble::getPos((Vector3d *)&local_1498,pSVar8);
            StuntDouble::getPos((Vector3d *)&lm,&this_01->super_StuntDouble);
            operator-((Vector<double,_3U> *)&local_1558,&local_1498,(Vector<double,_3U> *)&lm);
            Vector3<double>::operator=(&vec,(Vector<double,_3U> *)&local_1558);
            if (cVar1 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&vec);
            }
            dVar24 = Vector<double,_3U>::length(&vec.super_Vector<double,_3U>);
            if (dVar24 < this->rCut_) {
              local_14e8 = vec.super_Vector<double,_3U>.data_[2] / dVar24;
              local_1538 = atan2(vec.super_Vector<double,_3U>.data_[1],
                                 vec.super_Vector<double,_3U>.data_[0]);
              iVar15 = 1;
              for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
                sphericalHarmonic.L = (int)uVar20;
                uVar21 = -sphericalHarmonic.L;
                iVar16 = iVar15;
                while( true ) {
                  bVar23 = iVar16 == 0;
                  iVar16 = iVar16 + -1;
                  if (bVar23) break;
                  uVar30 = 0;
                  dVar24 = local_1538;
                  sphericalHarmonic.M = uVar21;
                  SphericalHarmonic::getValueAt(&sphericalHarmonic,local_14e8,local_1538);
                  local_1558.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((ulong)uVar21 << 0x20 | uVar20);
                  local_1528 = dVar24;
                  uStack_1520 = uVar30;
                  pmVar9 = std::
                           map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                           ::operator[](&q,(key_type *)&local_1558);
                  auVar29._0_8_ = extraout_XMM0_Qa + *(double *)pmVar9->_M_value;
                  auVar29._8_8_ = local_1528 + *(double *)(pmVar9->_M_value + 8);
                  *(undefined1 (*) [16])pmVar9->_M_value = auVar29;
                  uVar21 = uVar21 + 1;
                }
                iVar15 = iVar15 + 2;
              }
              local_155c = local_155c + 1;
              pSVar8 = local_14d0;
            }
          }
          ppAVar14 = ppAVar14 + 1;
          this_01 = (Atom *)0x0;
          if (ppAVar14 !=
              (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_0012bde3:
            this_01 = *ppAVar14;
          }
        }
        pMVar10 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&mi);
      }
      local_14e8 = (double)local_155c;
      iVar15 = 1;
      dStack_14e0 = local_14e8;
      for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
        q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] = 0.0;
        uVar21 = -(int)uVar20;
        iVar16 = iVar15;
        while( true ) {
          bVar23 = iVar16 == 0;
          iVar16 = iVar16 + -1;
          if (bVar23) break;
          kVar17 = (key_type)((ulong)uVar21 << 0x20 | uVar20);
          local_1558.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)kVar17;
          pmVar9 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](&q,(key_type *)&local_1558);
          auVar6._8_8_ = dStack_14e0;
          auVar6._0_8_ = local_14e8;
          auVar25 = divpd(*(undefined1 (*) [16])pmVar9->_M_value,auVar6);
          *(undefined1 (*) [16])pmVar9->_M_value = auVar25;
          local_1558.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)kVar17;
          pmVar9 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](&q,(key_type *)&local_1558);
          q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar20] =
               *(double *)pmVar9->_M_value * *(double *)pmVar9->_M_value +
               *(double *)(pmVar9->_M_value + 8) * *(double *)(pmVar9->_M_value + 8) +
               q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
          uVar21 = uVar21 + 1;
          this = local_1540;
        }
        dVar24 = (q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20] * 4.0 * 3.141592653589793) /
                 (double)((int)uVar20 * 2 + 1);
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        q_l.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] = dVar24;
        iVar15 = iVar15 + 2;
      }
      uVar21 = 1;
      for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
        local_1528 = (double)(uVar20 * 0x10);
        *(undefined8 *)
         w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar20]._M_value = 0;
        *(undefined8 *)
         (w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
          .super__Vector_impl_data._M_start[uVar20]._M_value + 8) = 0;
        local_1538 = (double)CONCAT44(local_1538._4_4_,(int)uVar20);
        for (uVar19 = -(int)uVar20;
            pcVar7 = w.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar19 != uVar21;
            uVar19 = uVar19 + 1) {
          lm = (pair<int,_int>)((ulong)uVar19 << 0x20 | uVar20);
          lVar18 = 0;
          iVar15 = local_1538._0_4_;
          while( true ) {
            pmVar11 = std::
                      map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      ::operator[](local_14c0,&lm);
            iVar16 = *pmVar11;
            pmVar11 = std::
                      map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                      ::operator[](local_1530,&lm);
            if ((long)iVar16 - (long)*pmVar11 < lVar18) break;
            puVar12 = (uint *)std::
                              map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                              ::operator[](local_1530,&lm);
            uVar2 = *puVar12;
            pmVar13 = std::
                      map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](local_14c8,&lm);
            pdVar3 = (pmVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pmVar9 = std::
                     map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                     ::operator[](&q,&lm);
            dVar24 = pdVar3[lVar18];
            local_1498.data_[0] = dVar24 * *(double *)pmVar9->_M_value;
            local_1498.data_[1] = dVar24 * *(double *)(pmVar9->_M_value + 8);
            local_1500 = (key_type)(lVar18 + (ulong)uVar2 << 0x20 | uVar20);
            pOVar28 = (pointer)local_1498.data_[0];
            pmVar9 = std::
                     map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                     ::operator[](&q,&local_1500);
            std::operator*((complex<double> *)&local_1498,pmVar9);
            local_1558.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = pOVar28;
            local_1508 = (key_type)((ulong)(iVar15 - uVar2) << 0x20 | uVar20);
            local_1558.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)extraout_XMM0_Qa_00;
            pOVar28 = local_1558.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pmVar9 = std::
                     map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                     ::operator[](&q,&local_1508);
            std::operator*((complex<double> *)&local_1558,pmVar9);
            dVar24 = *(double *)
                      ((long)((w.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_value +
                             (long)local_1528) + 8);
            *(double *)
             ((w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) =
                 extraout_XMM0_Qa_01 +
                 *(double *)
                  ((w.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528);
            *(double *)
             ((long)((w.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) + 8)
                 = (double)pOVar28 + dVar24;
            lVar18 = lVar18 + 1;
            iVar15 = iVar15 + -1;
          }
          local_1538 = (double)CONCAT44(local_1538._4_4_,local_1538._0_4_ + -1);
          this = local_1540;
        }
        auVar26._0_8_ =
             pow(q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20],1.5);
        auVar26._8_8_ = auVar26._0_8_;
        auVar25 = divpd(*(undefined1 (*) [16])(pcVar7->_M_value + (long)local_1528),auVar26);
        *(undefined1 (*) [16])
         ((w_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) = auVar25;
        uVar21 = uVar21 + 1;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_12a0,&q_l);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_12b8
                 ,&w_hat);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this,&local_12a0,&local_12b8);
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                (&local_12b8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_12a0);
      local_1518 = (ulong)(uint)((int)local_1518 + local_155c);
      iVar15 = 1;
      for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
        uVar21 = -(int)uVar20;
        iVar16 = iVar15;
        while( true ) {
          bVar23 = iVar16 == 0;
          iVar16 = iVar16 + -1;
          if (bVar23) break;
          kVar17 = (key_type)((ulong)uVar21 << 0x20 | uVar20);
          local_1558.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)kVar17;
          pmVar9 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](&q,(key_type *)&local_1558);
          dVar4 = *(double *)pmVar9->_M_value;
          dVar5 = *(double *)(pmVar9->_M_value + 8);
          local_1498.data_[0] = (double)kVar17;
          pmVar9 = std::
                   map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                   ::operator[](&QBar,(key_type *)&local_1498);
          dVar24 = *(double *)(pmVar9->_M_value + 8);
          *(double *)pmVar9->_M_value = *(double *)pmVar9->_M_value + dVar4 * local_14e8;
          *(double *)(pmVar9->_M_value + 8) = dVar24 + dVar5 * dStack_14e0;
          uVar21 = uVar21 + 1;
        }
        iVar15 = iVar15 + 2;
      }
      pSVar8 = SelectionManager::nextSelected(local_1510,&i);
    }
    iVar15 = local_14f8 + (this->super_StaticAnalyser).step_;
  }
  auVar25._0_8_ = (double)(int)local_1518;
  auVar25._8_8_ = auVar25._0_8_;
  iVar15 = 1;
  for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
    uVar21 = -(int)uVar20;
    iVar16 = iVar15;
    while( true ) {
      bVar23 = iVar16 == 0;
      iVar16 = iVar16 + -1;
      if (bVar23) break;
      local_1558.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar21 << 0x20 | uVar20);
      pmVar9 = std::
               map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
               ::operator[](&QBar,(key_type *)&local_1558);
      auVar27 = divpd(*(undefined1 (*) [16])pmVar9->_M_value,auVar25);
      *(undefined1 (*) [16])pmVar9->_M_value = auVar27;
      uVar21 = uVar21 + 1;
    }
    iVar15 = iVar15 + 2;
    this = local_1540;
  }
  iVar15 = 1;
  for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
    Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar20] = 0.0;
    uVar21 = -(int)uVar20;
    iVar16 = iVar15;
    while( true ) {
      bVar23 = iVar16 == 0;
      iVar16 = iVar16 + -1;
      if (bVar23) break;
      local_1558.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)uVar21 << 0x20 | uVar20);
      pmVar9 = std::
               map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
               ::operator[](&QBar,(key_type *)&local_1558);
      Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar20] =
           *(double *)pmVar9->_M_value * *(double *)pmVar9->_M_value +
           *(double *)(pmVar9->_M_value + 8) * *(double *)(pmVar9->_M_value + 8) +
           Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar20];
      uVar21 = uVar21 + 1;
    }
    dVar24 = (Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar20] * 4.0 * 3.141592653589793) / (double)((int)uVar20 * 2 + 1);
    if (dVar24 < 0.0) {
      dVar24 = sqrt(dVar24);
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    Q.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar20] = dVar24;
    iVar15 = iVar15 + 2;
    this = local_1540;
  }
  local_1568 = 1;
  for (uVar20 = 0; uVar20 != 0xd; uVar20 = uVar20 + 1) {
    local_1528 = (double)(uVar20 * 0x10);
    *(undefined8 *)
     W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
     super__Vector_impl_data._M_start[uVar20]._M_value = 0;
    *(undefined8 *)
     (W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20]._M_value + 8) = 0;
    uVar22 = uVar20 & 0xffffffff;
    uVar21 = -(int)uVar20;
    while (pcVar7 = W.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, uVar21 != local_1568) {
      lm = (pair<int,_int>)((ulong)uVar21 << 0x20 | uVar20);
      local_1538 = (double)CONCAT44(local_1538._4_4_,(int)uVar22);
      lVar18 = 0;
      local_14e8 = (double)(ulong)uVar21;
      while( true ) {
        pmVar11 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](local_14c0,&lm);
        iVar15 = *pmVar11;
        pmVar11 = std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[](local_1530,&lm);
        if ((long)iVar15 - (long)*pmVar11 < lVar18) break;
        puVar12 = (uint *)std::
                          map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                          ::operator[](local_1530,&lm);
        uVar21 = *puVar12;
        pmVar13 = std::
                  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_14c8,&lm);
        pdVar3 = (pmVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar9 = std::
                 map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                 ::operator[](&QBar,&lm);
        dVar24 = pdVar3[lVar18];
        local_1498.data_[0] = dVar24 * *(double *)pmVar9->_M_value;
        local_1498.data_[1] = dVar24 * *(double *)(pmVar9->_M_value + 8);
        local_1500 = (key_type)((ulong)uVar21 + lVar18 << 0x20 | uVar20);
        pOVar28 = (pointer)local_1498.data_[0];
        pmVar9 = std::
                 map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                 ::operator[](&QBar,&local_1500);
        std::operator*((complex<double> *)&local_1498,pmVar9);
        local_1558.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = pOVar28;
        local_1508 = (key_type)((ulong)((int)uVar22 - uVar21) << 0x20 | uVar20);
        local_1558.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)extraout_XMM0_Qa_02;
        pOVar28 = local_1558.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pmVar9 = std::
                 map<std::pair<int,_int>,_std::complex<double>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
                 ::operator[](&QBar,&local_1508);
        this = local_1540;
        std::operator*((complex<double> *)&local_1558,pmVar9);
        dVar24 = *(double *)
                  ((long)((W.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528)
                  + 8);
        *(double *)
         ((W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) =
             extraout_XMM0_Qa_03 +
             *(double *)
              ((W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528);
        *(double *)
         ((long)((W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) + 8) =
             (double)pOVar28 + dVar24;
        lVar18 = lVar18 + 1;
        uVar22 = (ulong)((int)uVar22 - 1);
      }
      uVar22 = (ulong)(local_1538._0_4_ - 1);
      uVar21 = SUB84(local_14e8,0) + 1;
    }
    auVar27._0_8_ =
         pow(Q2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar20],1.5);
    auVar27._8_8_ = auVar27._0_8_;
    auVar25 = divpd(*(undefined1 (*) [16])(pcVar7->_M_value + (long)local_1528),auVar27);
    *(undefined1 (*) [16])
     ((W_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->_M_value + (long)local_1528) = auVar25;
    local_1568 = local_1568 + 1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1330,&Q);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_1348,
             &W_hat);
  writeOrderParameter(this,(vector<double,_std::allocator<double>_> *)&local_1330,
                      (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                      &local_1348);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&local_1348);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1330);
  DumpReader::~DumpReader(&reader);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&W_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
            );
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&W.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Q.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Q2.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&QBar._M_t);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&w_hat.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
            );
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&w.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&q2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&q_l.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::complex<double>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::complex<double>_>_>_>
  ::~_Rb_tree(&q._M_t);
  return;
}

Assistant:

void BondOrderParameter::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    RealType costheta;
    RealType phi;
    RealType r;
    std::map<std::pair<int, int>, ComplexType> q;
    std::vector<RealType> q_l;
    std::vector<RealType> q2;
    std::vector<ComplexType> w;
    std::vector<ComplexType> w_hat;
    std::map<std::pair<int, int>, ComplexType> QBar;
    std::vector<RealType> Q2;
    std::vector<RealType> Q;
    std::vector<ComplexType> W;
    std::vector<ComplexType> W_hat;
    int nBonds, Nbonds;
    SphericalHarmonic sphericalHarmonic;
    int i;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    q_l.resize(lMax_ + 1);
    q2.resize(lMax_ + 1);
    w.resize(lMax_ + 1);
    w_hat.resize(lMax_ + 1);

    Q2.resize(lMax_ + 1);
    Q.resize(lMax_ + 1);
    W.resize(lMax_ + 1);
    W_hat.resize(lMax_ + 1);
    Nbonds = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;

        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] = 0.0;
          }
        }

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and build Q_lm(r) where
              //      Q_lm = Y_lm(theta(r),phi(r))
              // The spherical harmonics are wrt any arbitrary coordinate
              // system, we choose standard spherical coordinates

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                costheta = vec.z() / r;
                phi      = atan2(vec.y(), vec.x());

                for (int l = 0; l <= lMax_; l++) {
                  sphericalHarmonic.setL(l);
                  for (int m = -l; m <= l; m++) {
                    sphericalHarmonic.setM(m);
                    q[std::make_pair(l, m)] +=
                        sphericalHarmonic.getValueAt(costheta, phi);
                  }
                }
                nBonds++;
              }
            }
          }
        }

        for (int l = 0; l <= lMax_; l++) {
          q2[l] = 0.0;
          for (int m = -l; m <= l; m++) {
            q[std::make_pair(l, m)] /= (RealType)nBonds;

            q2[l] += norm(q[std::make_pair(l, m)]);
          }
          q_l[l] = sqrt(q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
        }

        // Find Third Order Invariant W_l

        for (int l = 0; l <= lMax_; l++) {
          w[l] = 0.0;
          for (int m1 = -l; m1 <= l; m1++) {
            std::pair<int, int> lm = std::make_pair(l, m1);
            for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
              int m2 = m2Min[lm] + mmm;
              int m3 = -m1 - m2;
              w[l] += w3j[lm][mmm] * q[lm] * q[std::make_pair(l, m2)] *
                      q[std::make_pair(l, m3)];
            }
          }

          w_hat[l] = w[l] / pow(q2[l], RealType(1.5));
        }

        collectHistogram(q_l, w_hat);

        Nbonds += nBonds;
        for (int l = 0; l <= lMax_; l++) {
          for (int m = -l; m <= l; m++) {
            QBar[std::make_pair(l, m)] +=
                (RealType)nBonds * q[std::make_pair(l, m)];
          }
        }
      }
    }

    // Normalize Qbar2
    for (int l = 0; l <= lMax_; l++) {
      for (int m = -l; m <= l; m++) {
        QBar[std::make_pair(l, m)] /= Nbonds;
      }
    }

    // Find second order invariant Q_l

    for (int l = 0; l <= lMax_; l++) {
      Q2[l] = 0.0;
      for (int m = -l; m <= l; m++) {
        Q2[l] += norm(QBar[std::make_pair(l, m)]);
      }
      Q[l] = sqrt(Q2[l] * 4.0 * Constants::PI / (RealType)(2 * l + 1));
    }

    // Find Third Order Invariant W_l

    for (int l = 0; l <= lMax_; l++) {
      W[l] = 0.0;
      for (int m1 = -l; m1 <= l; m1++) {
        std::pair<int, int> lm = std::make_pair(l, m1);
        for (int mmm = 0; mmm <= (m2Max[lm] - m2Min[lm]); mmm++) {
          int m2 = m2Min[lm] + mmm;
          int m3 = -m1 - m2;
          W[l] += w3j[lm][mmm] * QBar[lm] * QBar[std::make_pair(l, m2)] *
                  QBar[std::make_pair(l, m3)];
        }
      }

      W_hat[l] = W[l] / pow(Q2[l], RealType(1.5));
    }

    writeOrderParameter(Q, W_hat);
  }